

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

NotEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_notequal(NeuralNetworkLayer *this)

{
  NotEqualLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x334) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x334;
    this_00 = (NotEqualLayerParams *)operator_new(0x18);
    NotEqualLayerParams::NotEqualLayerParams(this_00);
    (this->layer_).notequal_ = this_00;
  }
  return (NotEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::NotEqualLayerParams* NeuralNetworkLayer::mutable_notequal() {
  if (!has_notequal()) {
    clear_layer();
    set_has_notequal();
    layer_.notequal_ = new ::CoreML::Specification::NotEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.notEqual)
  return layer_.notequal_;
}